

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_avx2.c
# Opt level: O1

uint aom_obmc_sad32x32_avx2(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *msk)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  auVar7._8_4_ = 0x800;
  auVar7._0_8_ = 0x80000000800;
  auVar7._12_4_ = 0x800;
  auVar7._16_4_ = 0x800;
  auVar7._20_4_ = 0x800;
  auVar7._24_4_ = 0x800;
  auVar7._28_4_ = 0x800;
  uVar3 = 8;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(pre + (uVar3 - 8));
    auVar2 = vpmovzxbd_avx2(auVar1);
    auVar8 = vlddqu_avx(*(undefined1 (*) [32])msk);
    auVar2 = vpmaddwd_avx2(auVar2,auVar8);
    auVar8 = vlddqu_avx(*(undefined1 (*) [32])wsrc);
    auVar8 = vpsubd_avx2(auVar8,auVar2);
    auVar8 = vpabsd_avx2(auVar8);
    auVar8 = vpaddd_avx2(auVar8,auVar7);
    auVar8 = vpsrld_avx2(auVar8,0xc);
    lVar5 = 0;
    if ((uVar3 & 0x18) == 0) {
      lVar5 = (long)(pre_stride + -0x20);
    }
    auVar8 = vpaddd_avx2(auVar8,auVar6._0_32_);
    auVar6 = ZEXT3264(auVar8);
    pre = pre + lVar5;
    uVar4 = uVar3 - 8;
    wsrc = (int32_t *)((long)wsrc + 0x20);
    msk = (int32_t *)((long)msk + 0x20);
    uVar3 = uVar3 + 8;
  } while (uVar4 < 0x3f8);
  auVar1 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  return auVar1._0_4_;
}

Assistant:

static inline unsigned int obmc_sad_w8n_avx2(
    const uint8_t *pre, const int pre_stride, const int32_t *wsrc,
    const int32_t *mask, const int width, const int height) {
  const int pre_step = pre_stride - width;
  int n = 0;
  __m256i v_sad_d = _mm256_setzero_si256();
  const __m256i v_bias_d = _mm256_set1_epi32((1 << 12) >> 1);
  assert(width >= 8);
  assert(IS_POWER_OF_TWO(width));

  do {
    const __m128i v_p0_b = xx_loadl_64(pre + n);
    const __m256i v_m0_d = _mm256_lddqu_si256((__m256i *)(mask + n));
    const __m256i v_w0_d = _mm256_lddqu_si256((__m256i *)(wsrc + n));

    const __m256i v_p0_d = _mm256_cvtepu8_epi32(v_p0_b);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m256i v_pm0_d = _mm256_madd_epi16(v_p0_d, v_m0_d);

    const __m256i v_diff0_d = _mm256_sub_epi32(v_w0_d, v_pm0_d);
    const __m256i v_absdiff0_d = _mm256_abs_epi32(v_diff0_d);

    // Rounded absolute difference
    const __m256i v_tmp_d = _mm256_add_epi32(v_absdiff0_d, v_bias_d);
    const __m256i v_rad0_d = _mm256_srli_epi32(v_tmp_d, 12);

    v_sad_d = _mm256_add_epi32(v_sad_d, v_rad0_d);

    n += 8;

    if ((n & (width - 1)) == 0) pre += pre_step;
  } while (n < width * height);

  __m128i v_sad_d_0 = _mm256_castsi256_si128(v_sad_d);
  __m128i v_sad_d_1 = _mm256_extracti128_si256(v_sad_d, 1);
  v_sad_d_0 = _mm_add_epi32(v_sad_d_0, v_sad_d_1);
  return xx_hsum_epi32_si32(v_sad_d_0);
}